

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOStreamBuffer.h
# Opt level: O3

bool __thiscall
Assimp::IOStreamBuffer<char>::getNextLine
          (IOStreamBuffer<char> *this,vector<char,_std::allocator<char>_> *buffer)

{
  byte bVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  
  std::vector<char,_std::allocator<char>_>::resize(buffer,this->m_cacheSize);
  uVar5 = this->m_cacheSize;
  uVar7 = this->m_cachePos;
  sVar6 = this->m_filePos;
  if (sVar6 == 0 || uVar7 == uVar5) {
    (*this->m_stream->_vptr_IOStream[4])(this->m_stream,sVar6,0);
    iVar3 = (*this->m_stream->_vptr_IOStream[2])
                      (this->m_stream,
                       (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,1,this->m_cacheSize);
    uVar7 = CONCAT44(extraout_var,iVar3);
    if (uVar7 == 0) {
      return false;
    }
    uVar5 = this->m_cacheSize;
    if (uVar7 < this->m_cacheSize) {
      this->m_cacheSize = uVar7;
      uVar5 = uVar7;
    }
    sVar6 = this->m_filePos + uVar5;
    this->m_filePos = sVar6;
    this->m_cachePos = 0;
    this->m_blockIdx = this->m_blockIdx + 1;
    uVar7 = 0;
  }
  pcVar2 = (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar1 = pcVar2[uVar7];
  uVar4 = uVar7;
  if (bVar1 - 0xc < 2) {
LAB_004b9048:
    do {
      uVar7 = uVar4 + 1;
      this->m_cachePos = uVar7;
      lVar8 = uVar4 + 1;
      uVar4 = uVar7;
    } while (pcVar2[lVar8] != '\n');
  }
  else if (bVar1 != 10) {
    if (bVar1 != 0) goto LAB_004b90bc;
    goto LAB_004b9048;
  }
  uVar7 = uVar7 + 1;
  this->m_cachePos = uVar7;
  if (uVar7 == uVar5) {
    (*this->m_stream->_vptr_IOStream[4])(this->m_stream,sVar6,0);
    iVar3 = (*this->m_stream->_vptr_IOStream[2])
                      (this->m_stream,
                       (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,1,this->m_cacheSize);
    uVar7 = CONCAT44(extraout_var_00,iVar3);
    if (uVar7 == 0) {
      return false;
    }
    uVar5 = this->m_cacheSize;
    if (uVar7 < this->m_cacheSize) {
      this->m_cacheSize = uVar7;
      uVar5 = uVar7;
    }
    this->m_filePos = this->m_filePos + uVar5;
    this->m_cachePos = 0;
    this->m_blockIdx = this->m_blockIdx + 1;
    uVar7 = 0;
  }
LAB_004b90bc:
  lVar8 = 0;
  while( true ) {
    bVar1 = (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7];
    if ((bVar1 < 0xe) && ((0x3401U >> (bVar1 & 0x1f) & 1) != 0)) break;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar8] = bVar1;
    uVar7 = this->m_cachePos + 1;
    this->m_cachePos = uVar7;
    if (this->m_cacheSize <= uVar7) {
      (*this->m_stream->_vptr_IOStream[4])(this->m_stream,this->m_filePos,0);
      iVar3 = (*this->m_stream->_vptr_IOStream[2])
                        (this->m_stream,
                         (this->m_cache).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,1,this->m_cacheSize);
      uVar7 = CONCAT44(extraout_var_01,iVar3);
      if (uVar7 == 0) {
        return false;
      }
      uVar5 = this->m_cacheSize;
      if (uVar7 < this->m_cacheSize) {
        this->m_cacheSize = uVar7;
        uVar5 = uVar7;
      }
      this->m_filePos = this->m_filePos + uVar5;
      this->m_cachePos = 0;
      this->m_blockIdx = this->m_blockIdx + 1;
      uVar7 = 0;
    }
    lVar8 = lVar8 + 1;
  }
  (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar8] = '\n';
  this->m_cachePos = this->m_cachePos + 1;
  return true;
}

Assistant:

AI_FORCE_INLINE
bool IOStreamBuffer<T>::getNextLine(std::vector<T> &buffer) {
    buffer.resize(m_cacheSize);
    if ( isEndOfCache( m_cachePos, m_cacheSize ) || 0 == m_filePos) {
       if (!readNextBlock()) {
          return false;
       }
      }

    if (IsLineEnd(m_cache[m_cachePos])) {
        // skip line end
        while (m_cache[m_cachePos] != '\n') {
            ++m_cachePos;
        }
        ++m_cachePos;
        if ( isEndOfCache( m_cachePos, m_cacheSize ) ) {
            if ( !readNextBlock() ) {
                return false;
            }
        }
    }

    size_t i( 0 );
    while (!IsLineEnd(m_cache[ m_cachePos ])) {
        buffer[i] = m_cache[ m_cachePos ];
        ++m_cachePos;
        ++i;
        if (m_cachePos >= m_cacheSize) {
            if (!readNextBlock()) {
                return false;
            }
        }
    }
    buffer[i] = '\n';
    ++m_cachePos;

    return true;
}